

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
          (QMovableArrayOps<QCss::Value> *this,qsizetype i,Value *args)

{
  Value **ppVVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  Value *pVVar4;
  Value *pVVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Value tmp;
  Inserter local_90;
  Type local_68;
  undefined4 uStack_64;
  anon_union_24_3_e3d07ef4_for_data aStack_60;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QCss::Value>).super_QArrayDataPointer<QCss::Value>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_00386585:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    aStack_60._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    aStack_60._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    aStack_60.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    _local_68 = CONCAT44(0xaaaaaaaa,args->type);
    ::QVariant::QVariant((QVariant *)&aStack_60,&args->variant);
    bVar6 = (this->super_QGenericArrayOps<QCss::Value>).super_QArrayDataPointer<QCss::Value>.size !=
            0;
    QArrayDataPointer<QCss::Value>::detachAndGrow
              ((QArrayDataPointer<QCss::Value> *)this,(uint)(i == 0 && bVar6),1,(Value **)0x0,
               (QArrayDataPointer<QCss::Value> *)0x0);
    if (i == 0 && bVar6) {
      pVVar4 = (this->super_QGenericArrayOps<QCss::Value>).super_QArrayDataPointer<QCss::Value>.ptr;
      pVVar4[-1].type = local_68;
      *(undefined8 *)((long)&pVVar4[-1].variant.d.data + 0x10) = aStack_60._16_8_;
      *(undefined1 **)&pVVar4[-1].variant.d.field_0x18 = local_48;
      pVVar4[-1].variant.d.data.shared = aStack_60.shared;
      *(undefined8 *)((long)&pVVar4[-1].variant.d.data + 8) = aStack_60._8_8_;
      aStack_60.shared = (PrivateShared *)0x0;
      aStack_60._8_8_ = 0;
      aStack_60._16_8_ = 0;
      local_48 = (undefined1 *)0x2;
      ppVVar1 = &(this->super_QGenericArrayOps<QCss::Value>).super_QArrayDataPointer<QCss::Value>.
                 ptr;
      *ppVVar1 = *ppVVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QCss::Value>).super_QArrayDataPointer<QCss::Value>.
                size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      pVVar5 = (this->super_QGenericArrayOps<QCss::Value>).super_QArrayDataPointer<QCss::Value>.ptr;
      pVVar4 = pVVar5 + i + 1;
      local_90.nInserts = 1;
      local_90.bytes =
           ((this->super_QGenericArrayOps<QCss::Value>).super_QArrayDataPointer<QCss::Value>.size -
           i) * 0x28;
      local_90.data = (QArrayDataPointer<QCss::Value> *)this;
      local_90.displaceTo = pVVar4;
      memmove(pVVar4,pVVar5 + i,local_90.bytes);
      pVVar4[-1].type = local_68;
      *(undefined8 *)((long)&pVVar4[-1].variant.d.data + 0x10) = aStack_60._16_8_;
      *(undefined1 **)&pVVar4[-1].variant.d.field_0x18 = local_48;
      pVVar4[-1].variant.d.data.shared = aStack_60.shared;
      *(undefined8 *)((long)&pVVar4[-1].variant.d.data + 8) = aStack_60._8_8_;
      aStack_60.shared = (PrivateShared *)0x0;
      aStack_60._8_8_ = 0;
      aStack_60._16_8_ = 0;
      local_48 = (undefined1 *)0x2;
      local_90.displaceFrom = pVVar4;
      Inserter::~Inserter(&local_90);
    }
    ::QVariant::~QVariant((QVariant *)&aStack_60);
  }
  else {
    if (((this->super_QGenericArrayOps<QCss::Value>).super_QArrayDataPointer<QCss::Value>.size == i)
       && (pVVar4 = (this->super_QGenericArrayOps<QCss::Value>).super_QArrayDataPointer<QCss::Value>
                    .ptr,
          (pDVar3->super_QArrayData).alloc - i !=
          ((long)((long)pVVar4 -
                 ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3)
          * -0x3333333333333333)) {
      pVVar4 = pVVar4 + i;
      pVVar4->type = args->type;
      ::QVariant::QVariant(&pVVar4->variant,&args->variant);
    }
    else {
      if ((i != 0) ||
         (pVVar4 = (this->super_QGenericArrayOps<QCss::Value>).super_QArrayDataPointer<QCss::Value>.
                   ptr,
         (Value *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
         pVVar4)) goto LAB_00386585;
      pVVar4[-1].type = args->type;
      ::QVariant::QVariant(&pVVar4[-1].variant,&args->variant);
      ppVVar1 = &(this->super_QGenericArrayOps<QCss::Value>).super_QArrayDataPointer<QCss::Value>.
                 ptr;
      *ppVVar1 = *ppVVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QCss::Value>).super_QArrayDataPointer<QCss::Value>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }